

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O1

void __thiscall sf::priv::GlContext::initialize(GlContext *this,ContextSettings *requestedSettings)

{
  uint *major;
  uint *minor;
  Uint32 *pUVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  GlFunctionPointer p_Var9;
  uint uVar10;
  int numExtensions;
  int minorVersion;
  int majorVersion;
  int flags;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  setActive(this,true);
  local_38 = 0;
  local_3c = 0;
  glGetIntegerv(0x821b);
  glGetIntegerv(0x821c,&local_3c);
  iVar5 = glGetError();
  if (iVar5 == 0x500) {
    (this->m_settings).majorVersion = 1;
    (this->m_settings).minorVersion = 1;
    pcVar6 = (char *)glGetString(0x1f02);
    if (pcVar6 == (char *)0x0) {
      poVar7 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"Unable to retrieve OpenGL version string, defaulting to 1.1",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      major = &(this->m_settings).majorVersion;
      minor = &(this->m_settings).minorVersion;
      bVar3 = anon_unknown.dwarf_83ac6::parseVersionString(pcVar6,"OpenGL ES-CL ",major,minor);
      if ((((!bVar3) &&
           (bVar3 = anon_unknown.dwarf_83ac6::parseVersionString(pcVar6,"OpenGL ES-CM ",major,minor)
           , !bVar3)) &&
          (bVar3 = anon_unknown.dwarf_83ac6::parseVersionString(pcVar6,"OpenGL ES ",major,minor),
          !bVar3)) &&
         (bVar3 = anon_unknown.dwarf_83ac6::parseVersionString(pcVar6,"",major,minor), !bVar3)) {
        poVar7 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"Unable to parse OpenGL version string: \"",0x28);
        sVar8 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", defaulting to 1.1",0x14);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
    }
  }
  else {
    (this->m_settings).majorVersion = local_38;
    (this->m_settings).minorVersion = local_3c;
  }
  (this->m_settings).attributeFlags = 0;
  if (2 < (this->m_settings).majorVersion) {
    local_34 = 0;
    glGetIntegerv(0x821e,&local_34);
    if ((local_34 & 2) != 0) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 4;
    }
    uVar10 = (this->m_settings).majorVersion;
    uVar2 = (this->m_settings).minorVersion;
    if (uVar2 == 1 && uVar10 == 3) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      p_Var9 = getFunction("glGetStringi");
      if (p_Var9 != (GlFunctionPointer)0x0) {
        local_40 = 0;
        glGetIntegerv(0x821d,&local_40);
        if (local_40 != 0) {
          uVar10 = 0;
          do {
            pcVar6 = (char *)(*p_Var9)(0x1f03,(ulong)uVar10);
            pcVar6 = strstr(pcVar6,"GL_ARB_compatibility");
            if (pcVar6 != (char *)0x0) {
              pUVar1 = &(this->m_settings).attributeFlags;
              *(byte *)pUVar1 = (byte)*pUVar1 & 0xfe;
              break;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_40);
        }
      }
    }
    else if (1 < uVar2 || 3 < uVar10) {
      local_40 = 0;
      glGetIntegerv(0x9126,&local_40);
      if ((local_40 & 1) != 0) {
        pUVar1 = &(this->m_settings).attributeFlags;
        *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      }
    }
  }
  if ((requestedSettings->antialiasingLevel == 0) || ((this->m_settings).antialiasingLevel == 0)) {
    (this->m_settings).antialiasingLevel = 0;
  }
  else {
    glEnable(0x809d);
  }
  if ((requestedSettings->sRgbCapable == true) && ((this->m_settings).sRgbCapable == true)) {
    glEnable(0x8db9);
    cVar4 = glIsEnabled(0x8db9);
    if (cVar4 != '\0') {
      return;
    }
    poVar7 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"Warning: Failed to enable GL_FRAMEBUFFER_SRGB",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  (this->m_settings).sRgbCapable = false;
  return;
}

Assistant:

void GlContext::initialize(const ContextSettings& requestedSettings)
{
    // Activate the context
    setActive(true);

    // Retrieve the context version number
    int majorVersion = 0;
    int minorVersion = 0;

    // Try the new way first
    glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
    glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

    if (glGetError() != GL_INVALID_ENUM)
    {
        m_settings.majorVersion = static_cast<unsigned int>(majorVersion);
        m_settings.minorVersion = static_cast<unsigned int>(minorVersion);
    }
    else
    {
        // Try the old way

        // If we can't get the version number, assume 1.1
        m_settings.majorVersion = 1;
        m_settings.minorVersion = 1;

        const char* version = reinterpret_cast<const char*>(glGetString(GL_VERSION));
        if (version)
        {
            // OpenGL ES Common Lite profile: The beginning of the returned string is "OpenGL ES-CL major.minor"
            // OpenGL ES Common profile:      The beginning of the returned string is "OpenGL ES-CM major.minor"
            // OpenGL ES Full profile:        The beginning of the returned string is "OpenGL ES major.minor"
            // Desktop OpenGL:                The beginning of the returned string is "major.minor"

            if (!parseVersionString(version, "OpenGL ES-CL ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES-CM ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES ",    m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "",              m_settings.majorVersion, m_settings.minorVersion))
            {
                err() << "Unable to parse OpenGL version string: \"" << version << "\", defaulting to 1.1" << std::endl;
            }
        }
        else
        {
            err() << "Unable to retrieve OpenGL version string, defaulting to 1.1" << std::endl;
        }
    }

    // 3.0 contexts only deprecate features, but do not remove them yet
    // 3.1 contexts remove features if ARB_compatibility is not present
    // 3.2+ contexts remove features only if a core profile is requested

    // If the context was created with wglCreateContext, it is guaranteed to be compatibility.
    // If a 3.0 context was created with wglCreateContextAttribsARB, it is guaranteed to be compatibility.
    // If a 3.1 context was created with wglCreateContextAttribsARB, the compatibility flag
    // is set only if ARB_compatibility is present
    // If a 3.2+ context was created with wglCreateContextAttribsARB, the compatibility flag
    // would have been set correctly already depending on whether ARB_create_context_profile is supported.

    // If the user requests a 3.0 context, it will be a compatibility context regardless of the requested profile.
    // If the user requests a 3.1 context and its creation was successful, the specification
    // states that it will not be a compatibility profile context regardless of the requested
    // profile unless ARB_compatibility is present.

    m_settings.attributeFlags = ContextSettings::Default;

    if (m_settings.majorVersion >= 3)
    {
        // Retrieve the context flags
        int flags = 0;
        glGetIntegerv(GL_CONTEXT_FLAGS, &flags);

        if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
            m_settings.attributeFlags |= ContextSettings::Debug;

        if ((m_settings.majorVersion == 3) && (m_settings.minorVersion == 1))
        {
            m_settings.attributeFlags |= ContextSettings::Core;

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(getFunction("glGetStringi"));

            if (glGetStringiFunc)
            {
                int numExtensions = 0;
                glGetIntegerv(GL_NUM_EXTENSIONS, &numExtensions);

                for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                {
                    const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                    if (std::strstr(extensionString, "GL_ARB_compatibility"))
                    {
                        m_settings.attributeFlags &= ~static_cast<Uint32>(ContextSettings::Core);
                        break;
                    }
                }
            }
        }
        else if ((m_settings.majorVersion > 3) || (m_settings.minorVersion >= 2))
        {
            // Retrieve the context profile
            int profile = 0;
            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);

            if (profile & GL_CONTEXT_CORE_PROFILE_BIT)
                m_settings.attributeFlags |= ContextSettings::Core;
        }
    }

    // Enable anti-aliasing if requested by the user and supported
    if ((requestedSettings.antialiasingLevel > 0) && (m_settings.antialiasingLevel > 0))
    {
        glEnable(GL_MULTISAMPLE);
    }
    else
    {
        m_settings.antialiasingLevel = 0;
    }

    // Enable sRGB if requested by the user and supported
    if (requestedSettings.sRgbCapable && m_settings.sRgbCapable)
    {
        glEnable(GL_FRAMEBUFFER_SRGB);

        // Check to see if the enable was successful
        if (glIsEnabled(GL_FRAMEBUFFER_SRGB) == GL_FALSE)
        {
            err() << "Warning: Failed to enable GL_FRAMEBUFFER_SRGB" << std::endl;
            m_settings.sRgbCapable = false;
        }
    }
    else
    {
        m_settings.sRgbCapable = false;
    }
}